

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

int X509_STORE_CTX_set_purpose(X509_STORE_CTX *ctx,int purpose)

{
  int iVar1;
  X509_PURPOSE *xp;
  int iVar2;
  
  iVar2 = 1;
  if (purpose != 0) {
    xp = X509_PURPOSE_get0(purpose);
    if (xp == (X509_PURPOSE *)0x0) {
      iVar2 = 0;
      ERR_put_error(0xb,0,0x82,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_vfy.cc"
                    ,0x5ad);
    }
    else {
      iVar1 = X509_PURPOSE_get_trust(xp);
      iVar1 = X509_STORE_CTX_set_trust(ctx,iVar1);
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      else if ((ctx->crls->stack).sorted == 0) {
        (ctx->crls->stack).sorted = purpose;
      }
    }
  }
  return iVar2;
}

Assistant:

int X509_STORE_CTX_set_purpose(X509_STORE_CTX *ctx, int purpose) {
  // If |purpose| is zero, this function historically silently did nothing.
  if (purpose == 0) {
    return 1;
  }

  const X509_PURPOSE *pobj = X509_PURPOSE_get0(purpose);
  if (pobj == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_PURPOSE_ID);
    return 0;
  }

  int trust = X509_PURPOSE_get_trust(pobj);
  if (!X509_STORE_CTX_set_trust(ctx, trust)) {
    return 0;
  }

  if (ctx->param->purpose == 0) {
    ctx->param->purpose = purpose;
  }
  return 1;
}